

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

void Acb_NtkSaveSupport(Acb_Ntk_t *p,int iObj)

{
  int *piVar1;
  int *pFanins;
  int local_18;
  int iFanin;
  int k;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  Vec_IntClear(&p->vSuppOld);
  local_18 = 0;
  piVar1 = Acb_ObjFanins(p,iObj);
  for (; local_18 < *piVar1; local_18 = local_18 + 1) {
    Vec_IntPush(&p->vSuppOld,piVar1[local_18 + 1]);
  }
  return;
}

Assistant:

void Acb_NtkSaveSupport( Acb_Ntk_t * p, int iObj )
{
    int k, iFanin, * pFanins; 
    Vec_IntClear( &p->vSuppOld );
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
        Vec_IntPush( &p->vSuppOld, iFanin );
}